

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

Am_Wrapper * ship_color_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Am_Wrapper *pAVar4;
  Am_Value *pAVar5;
  Am_Object local_28;
  int local_1c;
  Am_Object *pAStack_18;
  SP_Ship_Type st;
  Am_Object *self_local;
  
  pAStack_18 = self;
  uVar3 = Am_Object::Valid();
  if ((uVar3 & 1) != 0) {
    pAVar5 = (Am_Value *)Am_Object::Get(0x40a8,0x87);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    if (!bVar1) {
      pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
      return pAVar4;
    }
  }
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)pAStack_18);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_28,(ulong)SHIP_TYPE);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::~Am_Object(&local_28);
  local_1c = iVar2;
  if (iVar2 == 1) {
    self_local = (Am_Object *)
                 Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&SP_Federation_Blue);
  }
  else if (iVar2 == 2) {
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  }
  else {
    self_local = (Am_Object *)0x0;
  }
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Style_Formula(ship_color)
{
  if (Am_Screen.Valid())
    if (!(bool)Am_Screen.Get(Am_IS_COLOR))
      return Am_White;
  SP_Ship_Type st = (int)(self.Get_Owner().Get(SHIP_TYPE));
  if (st == FEDERATION)
    return (SP_Federation_Blue);
  else if (st == KLINGON)
    return (Am_Green);
  else {
    //Am_Error("ship_color: Invalid ship type.\n");
    return nullptr;
  }
}